

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void dfs(int head,int cur,int len,int *path)

{
  bool bVar1;
  int iVar2;
  int *__k;
  reference this;
  mapped_type *this_00;
  reference piVar3;
  int local_54;
  int j;
  int *x;
  iterator __end3;
  iterator __begin3;
  mapped_type *__range3;
  int *v;
  int i;
  int *path_local;
  int len_local;
  int cur_local;
  int head_local;
  
  vis[cur] = true;
  path[len + -1] = cur;
  for (v._4_4_ = 0; v._4_4_ < outDegrees[cur]; v._4_4_ = v._4_4_ + 1) {
    __k = G[cur] + v._4_4_;
    if ((isValid[*__k] == head + 100) && ((vis[*__k] & 1U) == 0)) {
      if (isTail[*__k] == -100 - head) {
        this = std::
               vector<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
               ::operator[](&pre,(long)head);
        this_00 = std::
                  unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::operator[](this,__k);
        __end3 = std::vector<int,_std::allocator<int>_>::begin(this_00);
        x = (int *)std::vector<int,_std::allocator<int>_>::end(this_00);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                           *)&x), bVar1) {
          piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&__end3);
          if ((vis[*piVar3] & 1U) == 0) {
            path[len] = *__k;
            path[len + 1] = *piVar3;
            for (local_54 = 0; local_54 < len + 1; local_54 = local_54 + 1) {
              iVar2 = sprintf(cycle[len + -1] + cycleNum[len + 2],"%d",(ulong)ids[path[local_54]]);
              cycleNum[len + 2] = iVar2 + cycleNum[len + 2];
              cycle[len + -1][cycleNum[len + 2]] = ',';
              cycleNum[len + 2] = cycleNum[len + 2] + 1;
            }
            iVar2 = sprintf(cycle[len + -1] + cycleNum[len + 2],"%d",(ulong)ids[path[len + 1]]);
            cycleNum[len + 2] = iVar2 + cycleNum[len + 2];
            cycle[len + -1][cycleNum[len + 2]] = '\n';
            cycleNum[len + 2] = cycleNum[len + 2] + 1;
            ansNum = ansNum + 1;
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end3);
        }
      }
      if (len < 5) {
        dfs(head,*__k,len + 1,path);
      }
    }
  }
  vis[cur] = false;
  return;
}

Assistant:

void dfs(int head, int cur, int len, int path[]) {
    vis[cur] = true;
    path[len - 1] = cur;
    for (int i = 0; i < outDegrees[cur]; ++i) {
        int &v = G[cur][i];
        if (isValid[v] != (head + 100) || vis[v])continue;
        if (isTail[v] == (-100 - head)) {
            for (auto &x :pre[head][v]) {
                if (!vis[x]) {
                    path[len] = v;
                    path[len + 1] = x;
                    for (int j = 0; j < len + 1; ++j) {
                        cycleNum[len + 2] += sprintf(cycle[len - 1] + cycleNum[len + 2], "%d", ids[path[j]]);
                        cycle[len - 1][cycleNum[len + 2]] = ',';
                        ++cycleNum[len + 2];
                    }
                    cycleNum[len + 2] += sprintf(cycle[len - 1] + cycleNum[len + 2], "%d", ids[path[len + 1]]);
                    cycle[len - 1][cycleNum[len + 2]] = '\n';
                    ++cycleNum[len + 2];
                    ++ansNum;
                }
            }
        }
        if (len < 5) {
            dfs(head, v, len + 1, path);
        }
    }
    vis[cur] = false;
}